

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::PReLU_x86_avx2::forward_inplace(PReLU_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 *puVar3;
  _func_int **pp_Var4;
  undefined1 auVar5 [32];
  int iVar6;
  int iVar7;
  float *slope;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  undefined1 (*pauVar12) [32];
  undefined1 (*pauVar13) [16];
  int iVar14;
  long lVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  
  auVar23 = _DAT_00315720;
  iVar6 = bottom_top_blob->dims;
  if (bottom_top_blob->elempack == 4) {
    if (iVar6 == 3) {
      iVar6 = bottom_top_blob->c;
      if (0 < (long)iVar6) {
        iVar7 = bottom_top_blob->h * bottom_top_blob->w;
        pp_Var4 = this->_vptr_PReLU_x86_avx2;
        lVar9 = 0;
        do {
          if (*(int *)(&this->field_0xd0 + (long)pp_Var4[-3]) < 2) {
            uVar2 = **(undefined4 **)(&this->field_0xd8 + (long)pp_Var4[-3]);
            auVar20._4_4_ = uVar2;
            auVar20._0_4_ = uVar2;
            auVar20._8_4_ = uVar2;
            auVar20._12_4_ = uVar2;
          }
          else {
            auVar20 = *(undefined1 (*) [16])
                       (*(undefined4 **)(&this->field_0xd8 + (long)pp_Var4[-3]) + lVar9 * 4);
          }
          if (0 < iVar7) {
            pauVar13 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar9 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar14 = iVar7;
            do {
              auVar19 = vmaxps_avx(*pauVar13,ZEXT816(0));
              auVar17 = vminps_avx(*pauVar13,ZEXT816(0));
              auVar19 = vfmadd213ps_fma(auVar17,auVar20,auVar19);
              *pauVar13 = auVar19;
              pauVar13 = pauVar13 + 1;
              iVar14 = iVar14 + -1;
            } while (iVar14 != 0);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != iVar6);
      }
    }
    else if (iVar6 == 2) {
      iVar6 = bottom_top_blob->h;
      if (0 < (long)iVar6) {
        iVar7 = bottom_top_blob->w;
        pp_Var4 = this->_vptr_PReLU_x86_avx2;
        lVar9 = 0;
        do {
          if (*(int *)(&this->field_0xd0 + (long)pp_Var4[-3]) < 2) {
            uVar2 = **(undefined4 **)(&this->field_0xd8 + (long)pp_Var4[-3]);
            auVar19._4_4_ = uVar2;
            auVar19._0_4_ = uVar2;
            auVar19._8_4_ = uVar2;
            auVar19._12_4_ = uVar2;
          }
          else {
            auVar19 = *(undefined1 (*) [16])
                       (*(undefined4 **)(&this->field_0xd8 + (long)pp_Var4[-3]) + lVar9 * 4);
          }
          if (0 < iVar7) {
            pauVar13 = (undefined1 (*) [16])
                       (bottom_top_blob->w * lVar9 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar14 = iVar7;
            do {
              auVar20 = vmaxps_avx(*pauVar13,ZEXT816(0));
              auVar17 = vminps_avx(*pauVar13,ZEXT816(0));
              auVar20 = vfmadd213ps_fma(auVar17,auVar19,auVar20);
              *pauVar13 = auVar20;
              pauVar13 = pauVar13 + 1;
              iVar14 = iVar14 + -1;
            } while (iVar14 != 0);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != iVar6);
      }
    }
    else if (iVar6 == 1) {
      uVar8 = bottom_top_blob->w;
      puVar3 = *(undefined4 **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx2[-3]);
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86_avx2[-3]) < 2) {
        if (0 < (int)uVar8) {
          uVar2 = *puVar3;
          auVar17._4_4_ = uVar2;
          auVar17._0_4_ = uVar2;
          auVar17._8_4_ = uVar2;
          auVar17._12_4_ = uVar2;
          lVar9 = 0;
          do {
            auVar20 = *(undefined1 (*) [16])((long)bottom_top_blob->data + lVar9);
            auVar19 = vmaxps_avx(auVar20,ZEXT816(0));
            auVar20 = vminps_avx(auVar20,ZEXT816(0));
            auVar20 = vfmadd213ps_fma(auVar20,auVar17,auVar19);
            *(undefined1 (*) [16])((long)bottom_top_blob->data + lVar9) = auVar20;
            lVar9 = lVar9 + 0x10;
          } while ((ulong)uVar8 << 4 != lVar9);
        }
      }
      else if (0 < (int)uVar8) {
        lVar9 = 0;
        do {
          auVar20 = *(undefined1 (*) [16])((long)bottom_top_blob->data + lVar9);
          auVar19 = vmaxps_avx(auVar20,ZEXT816(0));
          auVar20 = vminps_avx(auVar20,ZEXT816(0));
          auVar20 = vfmadd132ps_fma(auVar20,auVar19,*(undefined1 (*) [16])((long)puVar3 + lVar9));
          *(undefined1 (*) [16])((long)bottom_top_blob->data + lVar9) = auVar20;
          lVar9 = lVar9 + 0x10;
        } while ((ulong)uVar8 << 4 != lVar9);
      }
    }
  }
  else if (bottom_top_blob->elempack == 8) {
    if (iVar6 == 3) {
      iVar6 = bottom_top_blob->c;
      if (0 < (long)iVar6) {
        iVar7 = bottom_top_blob->h * bottom_top_blob->w;
        pp_Var4 = this->_vptr_PReLU_x86_avx2;
        lVar9 = 0;
        do {
          if (*(int *)(&this->field_0xd0 + (long)pp_Var4[-3]) < 2) {
            uVar2 = **(undefined4 **)(&this->field_0xd8 + (long)pp_Var4[-3]);
            auVar23._4_4_ = uVar2;
            auVar23._0_4_ = uVar2;
            auVar23._8_4_ = uVar2;
            auVar23._12_4_ = uVar2;
            auVar23._16_4_ = uVar2;
            auVar23._20_4_ = uVar2;
            auVar23._24_4_ = uVar2;
            auVar23._28_4_ = uVar2;
          }
          else {
            auVar23 = *(undefined1 (*) [32])
                       (*(undefined4 **)(&this->field_0xd8 + (long)pp_Var4[-3]) + lVar9 * 8);
          }
          if (0 < iVar7) {
            pauVar12 = (undefined1 (*) [32])
                       (bottom_top_blob->cstep * lVar9 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar14 = iVar7;
            do {
              auVar21 = vmaxps_avx(*pauVar12,ZEXT832(0));
              auVar22 = vminps_avx(*pauVar12,ZEXT832(0));
              auVar20 = vfmadd213ps_fma(auVar22,auVar23,auVar21);
              *pauVar12 = ZEXT1632(auVar20);
              pauVar12 = pauVar12 + 1;
              iVar14 = iVar14 + -1;
            } while (iVar14 != 0);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != iVar6);
      }
    }
    else if (iVar6 == 2) {
      iVar6 = bottom_top_blob->h;
      if (0 < (long)iVar6) {
        iVar7 = bottom_top_blob->w;
        pp_Var4 = this->_vptr_PReLU_x86_avx2;
        lVar9 = 0;
        do {
          if (*(int *)(&this->field_0xd0 + (long)pp_Var4[-3]) < 2) {
            uVar2 = **(undefined4 **)(&this->field_0xd8 + (long)pp_Var4[-3]);
            auVar22._4_4_ = uVar2;
            auVar22._0_4_ = uVar2;
            auVar22._8_4_ = uVar2;
            auVar22._12_4_ = uVar2;
            auVar22._16_4_ = uVar2;
            auVar22._20_4_ = uVar2;
            auVar22._24_4_ = uVar2;
            auVar22._28_4_ = uVar2;
          }
          else {
            auVar22 = *(undefined1 (*) [32])
                       (*(undefined4 **)(&this->field_0xd8 + (long)pp_Var4[-3]) + lVar9 * 8);
          }
          if (0 < iVar7) {
            pauVar12 = (undefined1 (*) [32])
                       (bottom_top_blob->w * lVar9 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar14 = iVar7;
            do {
              auVar23 = vmaxps_avx(*pauVar12,ZEXT832(0));
              auVar21 = vminps_avx(*pauVar12,ZEXT832(0));
              auVar20 = vfmadd213ps_fma(auVar21,auVar22,auVar23);
              *pauVar12 = ZEXT1632(auVar20);
              pauVar12 = pauVar12 + 1;
              iVar14 = iVar14 + -1;
            } while (iVar14 != 0);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != iVar6);
      }
    }
    else if (iVar6 == 1) {
      uVar8 = bottom_top_blob->w;
      puVar3 = *(undefined4 **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx2[-3]);
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86_avx2[-3]) < 2) {
        if (0 < (int)uVar8) {
          uVar2 = *puVar3;
          auVar18._4_4_ = uVar2;
          auVar18._0_4_ = uVar2;
          auVar18._8_4_ = uVar2;
          auVar18._12_4_ = uVar2;
          auVar18._16_4_ = uVar2;
          auVar18._20_4_ = uVar2;
          auVar18._24_4_ = uVar2;
          auVar18._28_4_ = uVar2;
          lVar9 = 0;
          do {
            auVar23 = *(undefined1 (*) [32])((long)bottom_top_blob->data + lVar9);
            auVar21 = vmaxps_avx(auVar23,ZEXT832(0));
            auVar23 = vminps_avx(auVar23,ZEXT832(0));
            auVar20 = vfmadd213ps_fma(auVar23,auVar18,auVar21);
            *(undefined1 (*) [32])((long)bottom_top_blob->data + lVar9) = ZEXT1632(auVar20);
            lVar9 = lVar9 + 0x20;
          } while ((ulong)uVar8 << 5 != lVar9);
        }
      }
      else if (0 < (int)uVar8) {
        lVar9 = 0;
        do {
          auVar23 = *(undefined1 (*) [32])((long)bottom_top_blob->data + lVar9);
          auVar21 = vmaxps_avx(auVar23,ZEXT832(0));
          auVar23 = vminps_avx(auVar23,ZEXT832(0));
          auVar20 = vfmadd132ps_fma(auVar23,auVar21,*(undefined1 (*) [32])((long)puVar3 + lVar9));
          *(undefined1 (*) [32])((long)bottom_top_blob->data + lVar9) = ZEXT1632(auVar20);
          lVar9 = lVar9 + 0x20;
        } while ((ulong)uVar8 << 5 != lVar9);
      }
    }
  }
  else {
    if (iVar6 != 3) {
      iVar6 = PReLU::forward_inplace
                        ((PReLU *)((long)&this->_vptr_PReLU_x86_avx2 +
                                  (long)this->_vptr_PReLU_x86_avx2[-3]),bottom_top_blob,opt);
      return iVar6;
    }
    iVar6 = bottom_top_blob->c;
    if (0 < (long)iVar6) {
      pp_Var4 = this->_vptr_PReLU_x86_avx2;
      uVar8 = bottom_top_blob->h * bottom_top_blob->w;
      lVar9 = *(long *)(&this->field_0xd8 + (long)pp_Var4[-3]);
      lVar15 = (ulong)(uVar8 & 7) - 1;
      auVar21._8_8_ = lVar15;
      auVar21._0_8_ = lVar15;
      auVar21._16_8_ = lVar15;
      auVar21._24_8_ = lVar15;
      auVar24._8_8_ = 0x8000000000000000;
      auVar24._0_8_ = 0x8000000000000000;
      auVar24._16_8_ = 0x8000000000000000;
      auVar24._24_8_ = 0x8000000000000000;
      auVar22 = vpcmpgtq_avx2(_DAT_003156e0,auVar21 ^ auVar24);
      auVar21 = vpcmpgtq_avx2(_DAT_00315700,auVar21 ^ auVar24);
      auVar21 = vpackssdw_avx2(auVar22,auVar21);
      auVar22 = vpcmpeqd_avx2(auVar22,auVar22);
      uVar10 = 0;
      do {
        pauVar12 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * uVar10 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar16 = uVar10 & 0xffffffff;
        if (*(int *)(&this->field_0xd0 + (long)pp_Var4[-3]) < 2) {
          uVar16 = 0;
        }
        fVar1 = *(float *)(lVar9 + uVar16 * 4);
        auVar24 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        if (0 < (int)uVar8 >> 3) {
          auVar25._4_4_ = fVar1;
          auVar25._0_4_ = fVar1;
          auVar25._8_4_ = fVar1;
          auVar25._12_4_ = fVar1;
          auVar25._16_4_ = fVar1;
          auVar25._20_4_ = fVar1;
          auVar25._24_4_ = fVar1;
          auVar25._28_4_ = fVar1;
          uVar11 = ((int)uVar8 >> 3) + 1;
          do {
            auVar5 = vmaxps_avx(*pauVar12,auVar24);
            auVar18 = vminps_avx(*pauVar12,auVar24);
            auVar20 = vfmadd213ps_fma(auVar18,auVar25,auVar5);
            *pauVar12 = ZEXT1632(auVar20);
            pauVar12 = pauVar12 + 1;
            uVar11 = uVar11 - 1;
          } while (1 < uVar11);
        }
        if ((uVar8 & 7) != 0) {
          auVar20 = vpackssdw_avx(SUB3216(auVar21 ^ auVar22,0),SUB3216(auVar21 ^ auVar22,0x10));
          auVar20 = vpshufd_avx(auVar20,0xd8);
          auVar25 = vpmovzxwd_avx2(auVar20);
          auVar25 = vpslld_avx2(auVar25,0x1f);
          auVar25 = vmaskmovps_avx(auVar25,*pauVar12);
          auVar24 = vcmpps_avx(auVar25,auVar24,1);
          auVar24 = vpshufb_avx2(auVar24,auVar23);
          auVar24 = vpermq_avx2(auVar24,0xe8);
          auVar20 = vpand_avx(auVar20,auVar24._0_16_);
          auVar24 = vpmovzxwd_avx2(auVar20);
          auVar24 = vpslld_avx2(auVar24,0x1f);
          auVar5._4_4_ = auVar25._4_4_ * fVar1;
          auVar5._0_4_ = auVar25._0_4_ * fVar1;
          auVar5._8_4_ = auVar25._8_4_ * fVar1;
          auVar5._12_4_ = auVar25._12_4_ * fVar1;
          auVar5._16_4_ = auVar25._16_4_ * fVar1;
          auVar5._20_4_ = auVar25._20_4_ * fVar1;
          auVar5._24_4_ = auVar25._24_4_ * fVar1;
          auVar5._28_4_ = fVar1;
          auVar24 = vmaskmovps_avx(auVar24,auVar5);
          *pauVar12 = auVar24;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != (long)iVar6);
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _slope = _mm256_loadu_ps(slope + i * 8);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
            else
            {
                __m256 _slope = _mm256_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _slope = _mm_loadu_ps(slope + i * 4);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
            else
            {
                __m128 _slope = _mm_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3)
        return PReLU::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    const float* slope_data_ptr = slope_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        float slope = num_slope > 1 ? slope_data_ptr[q] : slope_data_ptr[0];

#if __AVX__
        int nn = size >> 3;
        int remain = size - (nn << 3);
#else
        int remain = size;
#endif // __AVX__

#if __AVX__
        for (; nn > 0; nn--)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, prelu_avx(_p, _mm256_set1_ps(slope)));
            ptr += 8;
        }
#endif // __AVX__
        for (; remain > 0; remain--)
        {
            if (*ptr < 0)
                *ptr *= slope;

            ptr++;
        }
    }

    return 0;
}